

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  DInterpolation *pDVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 this_00;
  anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 *obj;
  
  obj = &this->interpolations[position].field_0;
  pDVar1 = GC::ReadBarrier<DInterpolation>(&obj->p);
  if (pDVar1 == (DInterpolation *)0x0) {
    switch(position) {
    case 0:
      this_00.p = (DInterpolation *)DObject::operator_new(0x80);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                ((DSectorPlaneInterpolation *)this_00.p,this,true,attach);
      break;
    case 1:
      this_00.p = (DInterpolation *)DObject::operator_new(0x80);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                ((DSectorPlaneInterpolation *)this_00.p,this,false,attach);
      break;
    case 2:
      this_00.p = (DInterpolation *)DObject::operator_new(0x70);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00.p,this,true);
      break;
    case 3:
      this_00.p = (DInterpolation *)DObject::operator_new(0x70);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00.p,this,false);
      break;
    default:
      return (DInterpolation *)0x0;
    }
    *obj = this_00;
  }
  pDVar1 = GC::ReadBarrier<DInterpolation>(&obj->p);
  pDVar1->refcount = pDVar1->refcount + 1;
  pDVar1 = GC::ReadBarrier<DInterpolation>(&obj->p);
  GC::WriteBarrier(&pDVar1->super_DObject);
  pDVar1 = GC::ReadBarrier<DInterpolation>(&obj->p);
  return pDVar1;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}